

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O1

size_t u16CTZ_fast(u16 w)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar4 = w << 8;
  uVar5 = uVar4;
  if (uVar4 == 0) {
    uVar5 = w;
  }
  uVar2 = (ulong)(uVar4 == 0) * 8;
  uVar3 = uVar2 | 4;
  uVar4 = uVar5 << 4;
  if ((ushort)(uVar5 << 4) == 0) {
    uVar3 = uVar2 + 8;
    uVar4 = uVar5;
  }
  uVar5 = uVar4 * 4;
  uVar2 = uVar3 - 2;
  if (uVar5 == 0) {
    uVar2 = uVar3;
    uVar5 = uVar4;
  }
  sVar1 = -2;
  if ((uVar5 & 0x7fc0) == 0) {
    sVar1 = (short)uVar5 >> 0xf;
  }
  return (long)sVar1 + uVar2;
}

Assistant:

size_t FAST(u16CTZ)(register u16 w)
{
	register size_t l = 16;
	register u16 t;
	if (t = w << 8)
		l -= 8, w = t;
	if (t = w << 4)
		l -= 4, w = t;
	if (t = w << 2)
		l -= 2, w = t;
	t = 0;
	return ((u16)(w << 1)) ? l - 2 : l - (w ? 1 : 0);
}